

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::GridDataType1::AddValue(GridDataType1 *this,KUINT16 V)

{
  value_type_conflict2 local_2;
  
  this->m_ui16NumValues = this->m_ui16NumValues + 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
            (&this->m_vui16Values,&local_2);
  return;
}

Assistant:

void GridDataType1:: AddValue( KUINT16 V )
{
    ++m_ui16NumValues;
    m_vui16Values.push_back( V );
}